

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_chunk_test.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::FindNextTest_AllEqual_Test::
~FindNextTest_AllEqual_Test(FindNextTest_AllEqual_Test *this)

{
  FindNextTest_AllEqual_Test *this_local;
  
  ~FindNextTest_AllEqual_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(FindNextTest, AllEqual) {
  const char* field_names[] = {"optional_int32", "optional_int64"};
  auto chunks = CreateAndCollectFields<TestAllTypes>(
      field_names, [](const FieldDescriptor* lhs, const FieldDescriptor* rhs) {
        return false;
      });
  auto it = FindNextUnequalChunk(
      chunks.begin(), chunks.end(),
      [](const FieldChunk&, const FieldChunk&) { return true; });

  EXPECT_EQ(it, chunks.end());
}